

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

bool woff2::TransformHmtxTable(Font *font)

{
  ulong uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  uint3 uVar5;
  bool bVar6;
  iterator iVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  Table *pTVar11;
  Table *pTVar12;
  Table *pTVar13;
  iterator *piVar14;
  mapped_type *pmVar15;
  uint uVar16;
  long lVar17;
  byte bVar18;
  ushort unaff_BP;
  iterator iVar19;
  size_type __n;
  uint glyph_index;
  bool bVar20;
  ushort *puVar21;
  short *psVar22;
  int16_t lsb;
  uint16_t advance_width;
  vector<unsigned_short,_std::allocator<unsigned_short>_> advance_widths;
  size_t glyph_size;
  uint8_t *glyph_data;
  Glyph glyph;
  ushort local_10c;
  unsigned_short local_10a;
  uint local_108;
  uint local_104;
  ulong local_100;
  short *local_f8;
  iterator iStack_f0;
  short *local_e8;
  short *local_d8;
  iterator iStack_d0;
  short *local_c8;
  ushort *local_b8;
  iterator iStack_b0;
  unsigned_short *local_a8;
  uint8_t *local_98;
  size_t local_90;
  uint local_88;
  uint local_84;
  ulong local_80;
  uint8_t *local_78;
  Glyph local_70;
  
  pTVar11 = Font::FindTable(font,0x676c7966);
  pTVar12 = Font::FindTable(font,0x686d7478);
  pTVar13 = Font::FindTable(font,0x68686561);
  bVar9 = true;
  if (pTVar11 != (Table *)0x0 && pTVar12 != (Table *)0x0) {
    if (pTVar13 == (Table *)0x0) {
      bVar9 = false;
    }
    else {
      uVar10 = pTVar13->length;
      bVar9 = false;
      if (0x21 < uVar10) {
        if (0x23 < uVar10) {
          unaff_BP = *(ushort *)(pTVar13->data + 0x22) << 8 | *(ushort *)(pTVar13->data + 0x22) >> 8
          ;
        }
        bVar20 = false;
        bVar9 = false;
        if ((0x23 < uVar10) && (unaff_BP != 0)) {
          uVar10 = NumGlyphs(font);
          local_a8 = (unsigned_short *)0x0;
          local_b8 = (ushort *)0x0;
          iStack_b0._M_current = (ushort *)0x0;
          local_c8 = (short *)0x0;
          local_d8 = (short *)0x0;
          iStack_d0._M_current = (short *)0x0;
          local_e8 = (short *)0x0;
          local_f8 = (short *)0x0;
          iStack_f0._M_current = (short *)0x0;
          uVar16 = (uint)unaff_BP;
          bVar4 = 0 < (int)uVar10;
          uVar5 = (uint3)(uVar10 >> 8);
          if ((int)uVar10 < 1) {
            local_104 = (uint)((int)uVar16 < (int)uVar10);
            local_108 = (uint)CONCAT71((uint7)uVar5,1);
            bVar9 = bVar20;
          }
          else {
            local_98 = pTVar12->data;
            local_80 = (ulong)pTVar12->length;
            local_104 = CONCAT31(uVar5,(int)uVar16 < (int)uVar10);
            local_108 = (uint)CONCAT71((uint7)uVar5,1);
            glyph_index = 0;
            local_100 = 0;
            local_88 = uVar16;
            local_84 = uVar10;
            do {
              local_70.instructions_size = 0;
              local_70.contours.
              super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_70.contours.
              super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_70.contours.
              super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_70.composite_data_size = 0;
              bVar9 = GetGlyphData(font,glyph_index,&local_78,&local_90);
              uVar8 = local_100;
              if ((bVar9) &&
                 ((local_90 == 0 ||
                  (bVar9 = ReadGlyph(local_78,local_90,&local_70), uVar8 = local_100, bVar9)))) {
                local_10a = 0;
                local_10c = 0;
                uVar1 = local_100 + 2;
                uVar8 = local_100;
                if (glyph_index < local_88) {
                  if (uVar1 <= local_80) {
                    local_10a = *(ushort *)(local_98 + local_100) << 8 |
                                *(ushort *)(local_98 + local_100) >> 8;
                    local_100 = local_100 + 4;
                    uVar8 = uVar1;
                    if (local_100 <= local_80) {
                      local_10c = *(ushort *)(local_98 + uVar1) << 8 |
                                  *(ushort *)(local_98 + uVar1) >> 8;
                      uVar10 = local_108 & 0xff;
                      local_108 = 0;
                      if (local_70.x_min == local_10c) {
                        local_108 = uVar10;
                      }
                      if (local_90 == 0) {
                        local_108 = uVar10;
                      }
                      if (iStack_b0._M_current == local_a8) {
                        std::vector<unsigned_short,std::allocator<unsigned_short>>::
                        _M_realloc_insert<unsigned_short_const&>
                                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                                   &local_b8,iStack_b0,&local_10a);
                      }
                      else {
                        *iStack_b0._M_current = local_10a;
                        iStack_b0._M_current = iStack_b0._M_current + 1;
                      }
                      if (iStack_d0._M_current != local_c8) {
                        *iStack_d0._M_current = local_10c;
                        piVar14 = &iStack_d0;
                        iVar19._M_current = iStack_d0._M_current;
                        goto LAB_0010a65d;
                      }
                      std::vector<short,std::allocator<short>>::_M_realloc_insert<short_const&>
                                ((vector<short,std::allocator<short>> *)&local_d8,iStack_d0,
                                 (short *)&local_10c);
                      goto LAB_0010a664;
                    }
                  }
                  goto LAB_0010a5ab;
                }
                if (local_80 < uVar1) goto LAB_0010a5ab;
                local_10c = *(ushort *)(local_98 + local_100) << 8 |
                            *(ushort *)(local_98 + local_100) >> 8;
                uVar10 = local_104 & 0xff;
                local_104 = 0;
                if (local_70.x_min == local_10c) {
                  local_104 = uVar10;
                }
                if (local_90 == 0) {
                  local_104 = uVar10;
                }
                local_100 = uVar1;
                if (iStack_f0._M_current == local_e8) {
                  std::vector<short,std::allocator<short>>::_M_realloc_insert<short_const&>
                            ((vector<short,std::allocator<short>> *)&local_f8,iStack_f0,
                             (short *)&local_10c);
                }
                else {
                  *iStack_f0._M_current = local_10c;
                  piVar14 = &iStack_f0;
                  iVar19._M_current = iStack_f0._M_current;
LAB_0010a65d:
                  piVar14->_M_current = iVar19._M_current + 1;
                }
LAB_0010a664:
                if (((local_108 & 1) == 0) && ((local_104 & 1) == 0)) {
                  bVar20 = true;
                  bVar6 = false;
                }
                else {
                  bVar6 = true;
                }
              }
              else {
LAB_0010a5ab:
                local_100 = uVar8;
                bVar6 = false;
                bVar20 = false;
              }
              std::
              vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
              ::~vector(&local_70.contours);
              bVar9 = bVar20;
              if (!bVar6) break;
              glyph_index = glyph_index + 1;
              bVar4 = (int)glyph_index < (int)local_84;
            } while (glyph_index != local_84);
          }
          if (!bVar4) {
            local_70.x_min = -0xb08;
            local_70.x_max = -0x1713;
            pmVar15 = std::
                      map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                      ::operator[](&font->tables,(key_type *)&local_70);
            uVar10 = local_104;
            bVar18 = (byte)local_108 & 1;
            lVar17 = 0;
            if ((local_108 & 1) == 0) {
              lVar17 = (long)iStack_d0._M_current - (long)local_d8;
            }
            __n = (long)iStack_b0._M_current + (lVar17 - (long)local_b8) + 1;
            if ((local_104 & 1) == 0) {
              __n = (long)iStack_f0._M_current + (__n - (long)local_f8);
            }
            else {
              bVar18 = bVar18 | 2;
            }
            this = &pmVar15->buffer;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(this,__n);
            puVar2 = (pmVar15->buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            puVar3 = (pmVar15->buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (this,(size_type)(puVar2 + (1 - (long)puVar3)));
            iVar7._M_current = iStack_b0._M_current;
            puVar2[(long)(this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start - (long)puVar3] = bVar18;
            for (puVar21 = local_b8; iVar19._M_current = iStack_d0._M_current,
                puVar21 != iVar7._M_current; puVar21 = puVar21 + 1) {
              anon_unknown_2::WriteUShort(this,(uint)*puVar21);
            }
            psVar22 = local_d8;
            if ((local_108 & 1) == 0) {
              for (; psVar22 != iVar19._M_current; psVar22 = psVar22 + 1) {
                anon_unknown_2::WriteUShort(this,(int)*psVar22);
              }
            }
            iVar19._M_current = iStack_f0._M_current;
            psVar22 = local_f8;
            if ((uVar10 & 1) == 0) {
              for (; psVar22 != iVar19._M_current; psVar22 = psVar22 + 1) {
                anon_unknown_2::WriteUShort(this,(int)*psVar22);
              }
            }
            pmVar15->tag = 0xe8edf4f8;
            pmVar15->flag_byte = '@';
            puVar2 = (pmVar15->buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pmVar15->length =
                 *(int *)&(pmVar15->buffer).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (int)puVar2;
            pmVar15->data = puVar2;
            bVar9 = true;
          }
          if (local_f8 != (short *)0x0) {
            operator_delete(local_f8);
          }
          if (local_d8 != (short *)0x0) {
            operator_delete(local_d8);
          }
          if (local_b8 != (ushort *)0x0) {
            operator_delete(local_b8);
          }
        }
      }
    }
  }
  return bVar9;
}

Assistant:

bool TransformHmtxTable(Font* font) {
  const Font::Table* glyf_table = font->FindTable(kGlyfTableTag);
  const Font::Table* hmtx_table = font->FindTable(kHmtxTableTag);
  const Font::Table* hhea_table = font->FindTable(kHheaTableTag);

  // If you don't have hmtx or a glyf not much is going to happen here
  if (hmtx_table == NULL || glyf_table == NULL) {
    return true;
  }

  // hmtx without hhea doesn't make sense
  if (hhea_table == NULL) {
    return FONT_COMPRESSION_FAILURE();
  }

  // Skip 34 to reach 'hhea' numberOfHMetrics
  Buffer hhea_buf(hhea_table->data, hhea_table->length);
  uint16_t num_hmetrics;
  if (!hhea_buf.Skip(34) || !hhea_buf.ReadU16(&num_hmetrics)) {
    return FONT_COMPRESSION_FAILURE();
  }

  // Must have at least one hMetric
  if (num_hmetrics < 1) {
    return FONT_COMPRESSION_FAILURE();
  }

  int num_glyphs = NumGlyphs(*font);

  // Most fonts can be transformed; assume it's a go until proven otherwise
  std::vector<uint16_t> advance_widths;
  std::vector<int16_t> proportional_lsbs;
  std::vector<int16_t> monospace_lsbs;

  bool remove_proportional_lsb = true;
  bool remove_monospace_lsb = (num_glyphs - num_hmetrics) > 0;

  Buffer hmtx_buf(hmtx_table->data, hmtx_table->length);
  for (int i = 0; i < num_glyphs; i++) {
    Glyph glyph;
    const uint8_t* glyph_data;
    size_t glyph_size;
    if (!GetGlyphData(*font, i, &glyph_data, &glyph_size) ||
        (glyph_size > 0 && !ReadGlyph(glyph_data, glyph_size, &glyph))) {
      return FONT_COMPRESSION_FAILURE();
    }

    uint16_t advance_width = 0;
    int16_t lsb = 0;

    if (i < num_hmetrics) {
      // [0, num_hmetrics) are proportional hMetrics
      if (!hmtx_buf.ReadU16(&advance_width)) {
        return FONT_COMPRESSION_FAILURE();
      }

      if (!hmtx_buf.ReadS16(&lsb)) {
        return FONT_COMPRESSION_FAILURE();
      }

      if (glyph_size > 0 && glyph.x_min != lsb) {
        remove_proportional_lsb = false;
      }

      advance_widths.push_back(advance_width);
      proportional_lsbs.push_back(lsb);
    } else {
      // [num_hmetrics, num_glyphs) are monospace leftSideBearing's
      if (!hmtx_buf.ReadS16(&lsb)) {
        return FONT_COMPRESSION_FAILURE();
      }
      if (glyph_size > 0 && glyph.x_min != lsb) {
        remove_monospace_lsb = false;
      }
      monospace_lsbs.push_back(lsb);
    }

    // If we know we can't optimize, bail out completely
    if (!remove_proportional_lsb && !remove_monospace_lsb) {
      return true;
    }
  }

  Font::Table* transformed_hmtx = &font->tables[kHmtxTableTag ^ 0x80808080];

  uint8_t flags = 0;
  size_t transformed_size = 1 + 2 * advance_widths.size();
  if (remove_proportional_lsb) {
    flags |= 1;
  } else {
    transformed_size += 2 * proportional_lsbs.size();
  }
  if (remove_monospace_lsb) {
    flags |= 1 << 1;
  } else {
    transformed_size += 2 * monospace_lsbs.size();
  }

  transformed_hmtx->buffer.reserve(transformed_size);
  std::vector<uint8_t>* out = &transformed_hmtx->buffer;
  WriteBytes(out, &flags, 1);
  for (uint16_t advance_width : advance_widths) {
    WriteUShort(out, advance_width);
  }

  if (!remove_proportional_lsb) {
    for (int16_t lsb : proportional_lsbs) {
      WriteUShort(out, lsb);
    }
  }
  if (!remove_monospace_lsb) {
    for (int16_t lsb : monospace_lsbs) {
      WriteUShort(out, lsb);
    }
  }

  transformed_hmtx->tag = kHmtxTableTag ^ 0x80808080;
  transformed_hmtx->flag_byte = 1 << 6;
  transformed_hmtx->length = transformed_hmtx->buffer.size();
  transformed_hmtx->data = transformed_hmtx->buffer.data();


  return true;
}